

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOptions.cpp
# Opt level: O2

bool __thiscall
nvtt::InputOptions::setMipmapData
          (InputOptions *this,void *data,int width,int height,int depth,int face,int mipLevel)

{
  bool bVar1;
  int iVar2;
  InputImage *pIVar3;
  Image *this_00;
  Color32 *__dest;
  
  if (depth != 1) {
    iVar2 = nvAbort("depth == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvtt/InputOptions.cpp"
                    ,0xc0,
                    "bool nvtt::InputOptions::setMipmapData(const void *, int, int, int, int, int)")
    ;
    if (iVar2 == 1) {
      raise(5);
    }
  }
  iVar2 = this->m->mipmapCount * face + mipLevel;
  pIVar3 = this->m->images;
  if ((((pIVar3[iVar2].width == width) && (pIVar3 = pIVar3 + iVar2, pIVar3->height == height)) &&
      (pIVar3->depth == depth)) && ((pIVar3->mipLevel == mipLevel && (pIVar3->face == face)))) {
    this_00 = (Image *)operator_new(0x18);
    nv::Image::Image(this_00);
    nv::AutoPtr<nv::Image>::operator=(&this->m->images[iVar2].data,this_00);
    nv::Image::allocate(this->m->images[iVar2].data.m_ptr,width,height);
    __dest = nv::Image::pixels(this->m->images[iVar2].data.m_ptr);
    memcpy(__dest,data,(long)(width * height * 4));
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool InputOptions::setMipmapData(const void * data, int width, int height, int depth /*= 1*/, int face /*= 0*/, int mipLevel /*= 0*/)
{
	nvCheck(depth == 1);
	
	const int idx = face * m.mipmapCount + mipLevel;
	
	if (m.images[idx].width != width || m.images[idx].height != height || m.images[idx].depth != depth || m.images[idx].mipLevel != mipLevel || m.images[idx].face != face)
	{
		// Invalid dimension or index.
		return false;
	}
	
	m.images[idx].data = new nv::Image();
	m.images[idx].data->allocate(width, height);
	memcpy(m.images[idx].data->pixels(), data, width * height * 4); 
	
	return true;
}